

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaUtilityTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaUtilityTargetGenerator::Generate(cmNinjaUtilityTargetGenerator *this,string *config)

{
  pointer pbVar1;
  size_t __n;
  bool bVar2;
  int iVar3;
  TargetType TVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  cmGlobalNinjaGenerator *this_00;
  const_iterator cVar6;
  pointer fileConfig;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  bVar2 = cmTarget::IsPerConfig
                    (((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget)->Target);
  if (!bVar2) {
    WriteUtilBuildStatements(this,config,config);
    return;
  }
  pvVar5 = cmCommonTargetGenerator::GetConfigNames_abi_cxx11_((cmCommonTargetGenerator *)this);
  fileConfig = (pvVar5->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (pvVar5->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (fileConfig != pbVar1) {
    do {
      this_00 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::GetCrossConfigs
                ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_60,this_00,fileConfig);
      cVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&local_60,config);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_60);
      if ((_Rb_tree_header *)cVar6._M_node != &local_60._M_impl.super__Rb_tree_header) {
        __n = fileConfig->_M_string_length;
        if (__n == config->_M_string_length) {
          if (__n != 0) {
            iVar3 = bcmp((fileConfig->_M_dataplus)._M_p,(config->_M_dataplus)._M_p,__n);
            if (iVar3 != 0) goto LAB_0029b50d;
          }
        }
        else {
LAB_0029b50d:
          TVar4 = cmGeneratorTarget::GetType
                            ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                             GeneratorTarget);
          if (TVar4 == GLOBAL_TARGET) goto LAB_0029b529;
        }
        WriteUtilBuildStatements(this,config,fileConfig);
      }
LAB_0029b529:
      fileConfig = fileConfig + 1;
    } while (fileConfig != pbVar1);
  }
  return;
}

Assistant:

void cmNinjaUtilityTargetGenerator::Generate(const std::string& config)
{
  if (!this->GetGeneratorTarget()->Target->IsPerConfig()) {
    this->WriteUtilBuildStatements(config, config);
    return;
  }

  for (auto const& fileConfig : this->GetConfigNames()) {
    if (!this->GetGlobalGenerator()
           ->GetCrossConfigs(fileConfig)
           .count(config)) {
      continue;
    }
    if (fileConfig != config &&
        this->GetGeneratorTarget()->GetType() == cmStateEnums::GLOBAL_TARGET) {
      continue;
    }
    this->WriteUtilBuildStatements(config, fileConfig);
  }
}